

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBSubtractRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  ushort uVar1;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  short sVar8;
  ushort uVar9;
  short sVar10;
  ushort uVar11;
  short sVar12;
  ushort uVar13;
  short sVar14;
  ushort uVar15;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  
  lVar7 = 0;
  if (width < 1) {
    width = 0;
  }
  for (; width != (int)lVar7; lVar7 = lVar7 + 1) {
    uVar5 = *(undefined4 *)(src_argb0 + lVar7 * 4);
    uVar6 = *(undefined4 *)(src_argb1 + lVar7 * 4);
    sVar8 = ((ushort)uVar5 & 0xff) - ((ushort)uVar6 & 0xff);
    sVar10 = (ushort)(byte)((uint)uVar5 >> 8) - (ushort)(byte)((uint)uVar6 >> 8);
    sVar12 = (ushort)(byte)((uint)uVar5 >> 0x10) - (ushort)(byte)((uint)uVar6 >> 0x10);
    sVar14 = (ushort)(byte)((uint)uVar5 >> 0x18) - (ushort)(byte)((uint)uVar6 >> 0x18);
    uVar1 = (ushort)(-1 < sVar8) * sVar8;
    uVar2 = (ushort)(-1 < sVar10) * sVar10;
    uVar3 = (ushort)(-1 < sVar12) * sVar12;
    uVar4 = (ushort)(-1 < sVar14) * sVar14;
    uVar9 = uVar1 & 0xff;
    uVar11 = uVar2 & 0xff;
    uVar13 = uVar3 & 0xff;
    uVar15 = uVar4 & 0xff;
    *(uint *)(dst_argb + lVar7 * 4) =
         CONCAT13((uVar15 != 0) * (uVar15 < 0x100) * (char)uVar4 - (0xff < uVar15),
                  CONCAT12((uVar13 != 0) * (uVar13 < 0x100) * (char)uVar3 - (0xff < uVar13),
                           CONCAT11((uVar11 != 0) * (uVar11 < 0x100) * (char)uVar2 - (0xff < uVar11)
                                    ,(uVar9 != 0) * (uVar9 < 0x100) * (char)uVar1 - (0xff < uVar9)))
                 );
  }
  return;
}

Assistant:

void ARGBSubtractRow_C(const uint8_t* src_argb0,
                       const uint8_t* src_argb1,
                       uint8_t* dst_argb,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const int b = src_argb0[0];
    const int g = src_argb0[1];
    const int r = src_argb0[2];
    const int a = src_argb0[3];
    const int b_sub = src_argb1[0];
    const int g_sub = src_argb1[1];
    const int r_sub = src_argb1[2];
    const int a_sub = src_argb1[3];
    dst_argb[0] = SHADE(b, b_sub);
    dst_argb[1] = SHADE(g, g_sub);
    dst_argb[2] = SHADE(r, r_sub);
    dst_argb[3] = SHADE(a, a_sub);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}